

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreeAxisForceTorqueContactSensor.cpp
# Opt level: O2

Vector3 * __thiscall
iDynTree::ThreeAxisForceTorqueContactSensor::computeThreeAxisForceTorqueFromLoadCellMeasurements
          (Vector3 *__return_storage_ptr__,ThreeAxisForceTorqueContactSensor *this,
          VectorDynSize *loadCellMeasurements)

{
  long lVar1;
  ulong uVar2;
  double *pdVar3;
  ulong uVar4;
  Wrench loadCellWrench;
  Wrench totalWrench;
  Transform local_110 [56];
  SpatialForceVector local_d8 [72];
  Transform sensor_H_loadCell;
  
  lVar1 = iDynTree::VectorDynSize::size();
  if (lVar1 == ((long)(this->pimpl->m_loadCellLocations).
                      super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->pimpl->m_loadCellLocations).
                     super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x18) {
    totalWrench._40_8_ = 0;
    totalWrench._48_8_ = 0;
    totalWrench._24_8_ = 0;
    totalWrench._32_8_ = 0;
    totalWrench._8_8_ = 0;
    totalWrench._16_8_ = 0;
    totalWrench._0_8_ = &PTR__SpatialForceVector_001e5f50;
    SpatialVector<iDynTree::SpatialForceVector>::zero
              ((SpatialVector<iDynTree::SpatialForceVector> *)&totalWrench.field_0x8);
    lVar1 = 0;
    uVar4 = 0;
    while( true ) {
      uVar2 = iDynTree::VectorDynSize::size();
      if (uVar2 <= uVar4) break;
      pdVar3 = (double *)iDynTree::VectorDynSize::operator()(loadCellMeasurements,uVar4);
      iDynTree::GeomVector3::GeomVector3((GeomVector3 *)&sensor_H_loadCell,0.0,0.0,*pdVar3);
      iDynTree::GeomVector3::GeomVector3((GeomVector3 *)local_d8,0.0,0.0,0.0);
      iDynTree::Wrench::Wrench
                (&loadCellWrench,(GeomVector3 *)&sensor_H_loadCell,(GeomVector3 *)local_d8);
      iDynTree::Rotation::Identity();
      iDynTree::Transform::Transform
                (&sensor_H_loadCell,(Rotation *)local_d8,
                 (this->pimpl->m_loadCellLocations).
                 super__Vector_base<iDynTree::Position,_std::allocator<iDynTree::Position>_>._M_impl
                 .super__Vector_impl_data._M_start + lVar1);
      iDynTree::Transform::operator*(local_110,(Wrench *)&sensor_H_loadCell);
      iDynTree::Wrench::operator+((Wrench *)local_d8,&totalWrench);
      iDynTree::Wrench::operator=(&totalWrench,(Wrench *)local_d8);
      iDynTree::SpatialForceVector::~SpatialForceVector(local_d8);
      iDynTree::SpatialForceVector::~SpatialForceVector((SpatialForceVector *)local_110);
      iDynTree::SpatialForceVector::~SpatialForceVector(&loadCellWrench.super_SpatialForceVector);
      uVar4 = uVar4 + 1;
      lVar1 = lVar1 + 0x18;
    }
    __return_storage_ptr__->m_data[0] = (double)totalWrench._24_8_;
    __return_storage_ptr__->m_data[1] = (double)totalWrench._32_8_;
    __return_storage_ptr__->m_data[2] = (double)totalWrench._40_8_;
    iDynTree::SpatialForceVector::~SpatialForceVector(&totalWrench.super_SpatialForceVector);
  }
  else {
    iDynTree::reportError
              ("ThreeAxisForceTorqueContactSensor",
               "computeThreeAxisForceTorqueFromLoadCellMeasurements",
               "loadCellMeasurements has the wrong size");
    VectorFixSize<3U>::zero(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector3  ThreeAxisForceTorqueContactSensor::computeThreeAxisForceTorqueFromLoadCellMeasurements(VectorDynSize& loadCellMeasurements) const
{
    if (loadCellMeasurements.size() != pimpl->m_loadCellLocations.size())
    {
        reportError("ThreeAxisForceTorqueContactSensor","computeThreeAxisForceTorqueFromLoadCellMeasurements", "loadCellMeasurements has the wrong size");
        Vector3 zero; zero.zero();
        return zero;
    }

    Wrench totalWrench;
    totalWrench.zero();

    for (size_t i=0; i < loadCellMeasurements.size(); i++)
    {
        // We assume that the total forcetorque is given by the sum of pure forces on the z axis measured by the load cells
        Wrench loadCellWrench = Wrench(LinearForceVector3(0.0, 0.0, loadCellMeasurements(i)*1.0), AngularForceVector3(0.0, 0.0, 0.0));
        Transform sensor_H_loadCell(Rotation::Identity(), pimpl->m_loadCellLocations[i]);
        totalWrench = totalWrench + sensor_H_loadCell*loadCellWrench;
    }

    // Project the force torque
    Vector3 ret;
    ret(0) = totalWrench.getLinearVec3()(2);
    ret(1) = totalWrench.getAngularVec3()(0);
    ret(2) = totalWrench.getAngularVec3()(1);

    return ret;
}